

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *pTVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  TestShaderType local_3f4;
  string variable_constructor;
  long *local_3d0;
  long local_3c8;
  long local_3c0;
  long lStack_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string valid_size_initializers [15];
  
  valid_size_initializers[0]._M_dataplus._M_p = (pointer)&valid_size_initializers[0].field_2;
  local_3f4 = tested_shader_type;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)valid_size_initializers,"[1][1][1][]","");
  valid_size_initializers[1]._M_dataplus._M_p = (pointer)&valid_size_initializers[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 1),"[1][1][][1]","");
  valid_size_initializers[2]._M_dataplus._M_p = (pointer)&valid_size_initializers[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 2),"[1][][1][1]","");
  valid_size_initializers[3]._M_dataplus._M_p = (pointer)&valid_size_initializers[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 3),"[][1][1][1]","");
  valid_size_initializers[4]._M_dataplus._M_p = (pointer)&valid_size_initializers[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 4),"[1][1][][]","");
  valid_size_initializers[5]._M_dataplus._M_p = (pointer)&valid_size_initializers[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 5),"[1][][1][]","");
  valid_size_initializers[6]._M_dataplus._M_p = (pointer)&valid_size_initializers[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 6),"[][1][1][]","");
  valid_size_initializers[7]._M_dataplus._M_p = (pointer)&valid_size_initializers[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 7),"[1][][][1]","");
  valid_size_initializers[8]._M_dataplus._M_p = (pointer)&valid_size_initializers[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 8),"[][1][][1]","");
  valid_size_initializers[9]._M_dataplus._M_p = (pointer)&valid_size_initializers[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 9),"[][][1][1]","");
  valid_size_initializers[10]._M_dataplus._M_p = (pointer)&valid_size_initializers[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 10),"[1][][][]","");
  valid_size_initializers[0xb]._M_dataplus._M_p = (pointer)&valid_size_initializers[0xb].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 0xb),"[][1][][]","");
  valid_size_initializers[0xc]._M_dataplus._M_p = (pointer)&valid_size_initializers[0xc].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 0xc),"[][][1][]","");
  valid_size_initializers[0xd]._M_dataplus._M_p = (pointer)&valid_size_initializers[0xd].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 0xd),"[][][][1]","");
  valid_size_initializers[0xe]._M_dataplus._M_p = (pointer)&valid_size_initializers[0xe].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(valid_size_initializers + 0xe),"[][][][]","");
  lVar4 = 0x222cb38;
  if (supported_variable_types_map._16_8_ != 0) {
    lVar4 = 0x222cb38;
    lVar5 = supported_variable_types_map._16_8_;
    do {
      if (*(int *)Interface::GL::var_types <= *(int *)(lVar5 + 0x20)) {
        lVar4 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 +
                       (ulong)(*(int *)(lVar5 + 0x20) < *(int *)Interface::GL::var_types) * 8);
    } while (lVar5 != 0);
  }
  lVar5 = 0x222cb38;
  if ((lVar4 != 0x222cb38) &&
     (lVar5 = lVar4, *(int *)Interface::GL::var_types < *(int *)(lVar4 + 0x20))) {
    lVar5 = 0x222cb38;
  }
  if (lVar5 == 0x222cb38) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x92b);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_238,"    ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x28)
                );
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_418 = &local_408;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_408 = *plVar6;
    lStack_400 = plVar1[3];
  }
  else {
    local_408 = *plVar6;
    local_418 = (long *)*plVar1;
  }
  local_410 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_418,(ulong)valid_size_initializers[0]._M_dataplus._M_p)
  ;
  local_3d0 = &local_3c0;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_3c0 = *plVar6;
    lStack_3b8 = plVar1[3];
  }
  else {
    local_3c0 = *plVar6;
    local_3d0 = (long *)*plVar1;
  }
  local_3c8 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_3b0 = &local_3a0;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_3a0 = *plVar6;
    lStack_398 = plVar1[3];
  }
  else {
    local_3a0 = *plVar6;
    local_3b0 = (long *)*plVar1;
  }
  local_3a8 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_3b0,*(ulong *)(lVar5 + 0x28));
  local_390 = &local_380;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_380 = *plVar6;
    lStack_378 = plVar1[3];
  }
  else {
    local_380 = *plVar6;
    local_390 = (long *)*plVar1;
  }
  local_388 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_390);
  local_370 = &local_360;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_360 = *plVar6;
    lStack_358 = plVar1[3];
  }
  else {
    local_360 = *plVar6;
    local_370 = (long *)*plVar1;
  }
  local_368 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_370,*(ulong *)(lVar5 + 0x28));
  local_350 = &local_340;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_340 = *plVar6;
    lStack_338 = plVar1[3];
  }
  else {
    local_340 = *plVar6;
    local_350 = (long *)*plVar1;
  }
  local_348 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_350);
  local_330 = &local_320;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_320 = *plVar6;
    lStack_318 = plVar1[3];
  }
  else {
    local_320 = *plVar6;
    local_330 = (long *)*plVar1;
  }
  local_328 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_330,*(ulong *)(lVar5 + 0x28));
  local_310 = &local_300;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_300 = *plVar6;
    lStack_2f8 = plVar1[3];
  }
  else {
    local_300 = *plVar6;
    local_310 = (long *)*plVar1;
  }
  local_308 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_2f0 = &local_2e0;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_2e0 = *plVar6;
    lStack_2d8 = plVar1[3];
  }
  else {
    local_2e0 = *plVar6;
    local_2f0 = (long *)*plVar1;
  }
  local_2e8 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_2f0,*(ulong *)(lVar5 + 0x28));
  local_2d0 = &local_2c0;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_2c0 = *plVar6;
    lStack_2b8 = plVar1[3];
  }
  else {
    local_2c0 = *plVar6;
    local_2d0 = (long *)*plVar1;
  }
  local_2c8 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0 = &local_2a0;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_2a0 = *plVar6;
    lStack_298 = plVar1[3];
  }
  else {
    local_2a0 = *plVar6;
    local_2b0 = (long *)*plVar1;
  }
  local_2a8 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_2b0,*(ulong *)(lVar5 + 0x88));
  local_290 = &local_280;
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_280 = *plVar6;
    lStack_278 = plVar1[3];
  }
  else {
    local_280 = *plVar6;
    local_290 = (long *)*plVar1;
  }
  local_288 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_290);
  variable_constructor._M_dataplus._M_p = (pointer)&variable_constructor.field_2;
  psVar7 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar7) {
    variable_constructor.field_2._M_allocated_capacity = *psVar7;
    variable_constructor.field_2._8_8_ = plVar1[3];
  }
  else {
    variable_constructor.field_2._M_allocated_capacity = *psVar7;
    variable_constructor._M_dataplus._M_p = (pointer)*plVar1;
  }
  variable_constructor._M_string_length = plVar1[1];
  *plVar1 = (long)psVar7;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390,local_380 + 1);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0 + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,local_408 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::_M_append
            ((char *)&shader_source,(ulong)variable_constructor._M_dataplus._M_p);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_3f4) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x923);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar8 = (ulong)local_3f4;
  puVar2 = &set_tesseation_abi_cxx11_;
  switch(uVar8) {
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 3:
    puVar2 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_3f4) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x926);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*(code *)(&DAT_01b0e560 + *(int *)(&DAT_01b0e560 + uVar8 * 4)))
            (&DAT_01b0e560 + *(int *)(&DAT_01b0e560 + uVar8 * 4),empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConstructorSizing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string valid_size_initializers[] = { "[1][1][1][]", "[1][1][][1]", "[1][][1][1]", "[][1][1][1]", "[1][1][][]",
											  "[1][][1][]",  "[][1][1][]",  "[1][][][1]",  "[][1][][1]",  "[][][1][1]",
											  "[1][][][]",   "[][1][][]",   "[][][1][]",   "[][][][1]",   "[][][][]" };

	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t valid_size_initializers_index = 0;
				 valid_size_initializers_index < sizeof(valid_size_initializers) / sizeof(valid_size_initializers[0]);
				 valid_size_initializers_index++)
			{
				std::string shader_source;
				std::string variable_constructor =
					"    " + var_iterator->second.type + " x" + valid_size_initializers[valid_size_initializers_index] +
					" = " + var_iterator->second.type + "[1][1][1][1](" + var_iterator->second.type + "[1][1][1](" +
					var_iterator->second.type + "[1][1](" + var_iterator->second.type + "[1](" +
					var_iterator->second.initializer_with_zeroes + "))));\n";

				shader_source = shader_start;
				shader_source += variable_constructor;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int valid_size_initializers_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}